

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.y
# Opt level: O1

int4 __thiscall XmlScan::scanCData(XmlScan *this)

{
  uint uVar1;
  uint uVar2;
  string *psVar3;
  
  clearlvalue(this);
  psVar3 = (string *)operator_new(0x20);
  (psVar3->_M_dataplus)._M_p = (pointer)&psVar3->field_2;
  psVar3->_M_string_length = 0;
  (psVar3->field_2)._M_local_buf[0] = '\0';
  this->lvalue = psVar3;
  do {
    uVar1 = this->pos;
    uVar2 = this->lookahead[uVar1 & 3];
    if (uVar2 == 0x5d) {
      if ((this->lookahead[uVar1 + 1 & 3] == 0x5d) && (this->lookahead[uVar1 & 3 ^ 2] == 0x3e)) {
        return 0x103;
      }
    }
    else if (uVar2 == 0xffffffff) {
      return 0x103;
    }
    if ((int)uVar2 < 0x20) {
      if (0xd < uVar2) {
        return 0x103;
      }
      if ((0x2600U >> (uVar2 & 0x1f) & 1) == 0) {
        return 0x103;
      }
    }
    getxmlchar(this);
    std::__cxx11::string::push_back((char)this->lvalue);
  } while( true );
}

Assistant:

int4 XmlScan::scanCData(void)

{				// Look for "]]>" and non-Char
  clearlvalue();
  lvalue = new string();

  while(next(0) != -1) {
    if (next(0)==']')
      if (next(1)==']')
	if (next(2)=='>')
	  break;
    if (!isChar(next(0))) break;
    *lvalue += getxmlchar();
  }
  return CDataToken;		// CData can be empty
}